

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

string * to_str_abi_cxx11_(string *__return_storage_ptr__,uchar c)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  int iVar4;
  undefined7 in_register_00000031;
  ostringstream strm;
  uchar local_189;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  iVar4 = (int)CONCAT71(in_register_00000031,c);
  iVar1 = isprint(iVar4);
  if (iVar1 == 0) {
    local_189 = '<';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,(char *)&local_189,1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    local_189 = '>';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_189,1);
  }
  else {
    local_189 = c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,(char *)&local_189,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  psVar3 = (string *)std::ios_base::~ios_base(local_118);
  return psVar3;
}

Assistant:

static std::string to_str(unsigned char c)
{
	std::ostringstream strm;
	if (isprint(c)) strm << c;
	else            strm << '<' << int(c) << '>';
	return strm.str();
}